

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestFrameDropLarge::~DatarateTestFrameDropLarge
          (DatarateTestFrameDropLarge *this)

{
  code *pcVar1;
  DatarateTestFrameDropLarge *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~DatarateTestFrameDropLarge() override = default;